

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

int32_t ustrcase_mapWithOverlap_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *iter,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,
                  UStringCaseMapper *stringCaseMapper,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t count;
  UChar **ppUStack_2a0;
  int32_t destLength;
  UChar *temp;
  UChar buffer [300];
  UChar *src_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  BreakIterator *iter_local;
  uint32_t options_local;
  int32_t caseLocale_local;
  
  buffer._592_8_ = src;
  UVar1 = U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((destCapacity < 0) ||
       ((((dest == (UChar *)0x0 && (0 < destCapacity)) || (buffer._592_8_ == 0)) || (srcLength < -1)
        ))) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      options_local = 0;
    }
    else {
      if (srcLength == -1) {
        srcLength = u_strlen_63((UChar *)buffer._592_8_);
      }
      ppUStack_2a0 = (UChar **)dest;
      if ((dest != (UChar *)0x0) &&
         (((dest <= (ulong)buffer._592_8_ && ((ulong)buffer._592_8_ < dest + destCapacity)) ||
          (((ulong)buffer._592_8_ <= dest &&
           (dest < (UChar *)(buffer._592_8_ + (long)srcLength * 2))))))) {
        if (destCapacity < 0x12d) {
          ppUStack_2a0 = &temp;
        }
        else {
          ppUStack_2a0 = (UChar **)uprv_malloc_63((long)(destCapacity << 1));
          if (ppUStack_2a0 == (UChar **)0x0) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
            return 0;
          }
        }
      }
      count = (*stringCaseMapper)(caseLocale,options,iter,(char16_t *)ppUStack_2a0,destCapacity,
                                  (char16_t *)buffer._592_8_,srcLength,(Edits *)0x0,errorCode);
      if (ppUStack_2a0 != (UChar **)dest) {
        UVar1 = U_SUCCESS(*errorCode);
        if (((UVar1 != '\0') && (0 < count)) && (count <= destCapacity)) {
          u_memmove_63(dest,(UChar *)ppUStack_2a0,count);
        }
        if (ppUStack_2a0 != &temp) {
          uprv_free_63(ppUStack_2a0);
        }
      }
      options_local = u_terminateUChars_63(dest,destCapacity,count,errorCode);
    }
  }
  else {
    options_local = 0;
  }
  return options_local;
}

Assistant:

U_CFUNC int32_t
ustrcase_mapWithOverlap(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_PARAM
                        UChar *dest, int32_t destCapacity,
                        const UChar *src, int32_t srcLength,
                        UStringCaseMapper *stringCaseMapper,
                        UErrorCode &errorCode) {
    UChar buffer[300];
    UChar *temp;

    int32_t destLength;

    /* check argument values */
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if( destCapacity<0 ||
        (dest==NULL && destCapacity>0) ||
        src==NULL ||
        srcLength<-1
    ) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* get the string length */
    if(srcLength==-1) {
        srcLength=u_strlen(src);
    }

    /* check for overlapping source and destination */
    if( dest!=NULL &&
        ((src>=dest && src<(dest+destCapacity)) ||
         (dest>=src && dest<(src+srcLength)))
    ) {
        /* overlap: provide a temporary destination buffer and later copy the result */
        if(destCapacity<=UPRV_LENGTHOF(buffer)) {
            /* the stack buffer is large enough */
            temp=buffer;
        } else {
            /* allocate a buffer */
            temp=(UChar *)uprv_malloc(destCapacity*U_SIZEOF_UCHAR);
            if(temp==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
                return 0;
            }
        }
    } else {
        temp=dest;
    }

    destLength=stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                                temp, destCapacity, src, srcLength, NULL, errorCode);
    if(temp!=dest) {
        /* copy the result string to the destination buffer */
        if (U_SUCCESS(errorCode) && 0 < destLength && destLength <= destCapacity) {
            u_memmove(dest, temp, destLength);
        }
        if(temp!=buffer) {
            uprv_free(temp);
        }
    }

    return u_terminateUChars(dest, destCapacity, destLength, &errorCode);
}